

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real __thiscall amrex::MultiFab::min(MultiFab *this,int comp,int nghost,bool local)

{
  int iVar1;
  int iVar2;
  CpOp CVar3;
  int iVar4;
  int iVar5;
  CoordType CVar6;
  bool bVar7;
  FabType FVar8;
  FabFactory<amrex::FArrayBox> *pFVar9;
  double *pdVar10;
  byte in_CL;
  int in_ESI;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *a_1;
  Box *bx_1;
  MFIter mfi_1;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *a;
  Array4<const_amrex::EBCellFlag> *flag;
  Box *bx;
  MFIter mfi;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *ebfactory;
  Real mn;
  MFIter *in_stack_fffffffffffffb38;
  MPI_Comm comm;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffb40;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffb48;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb50;
  long *plVar11;
  undefined8 in_stack_fffffffffffffb60;
  undefined1 do_tiling_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  FabArrayBase *in_stack_fffffffffffffb68;
  MFIter *in_stack_fffffffffffffb70;
  int local_474;
  CoordType local_470;
  EBSupport local_46c;
  int in_stack_fffffffffffffbac;
  CoordType in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  long local_428 [8];
  long *local_3e8;
  undefined8 local_3c0;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  int local_344;
  int local_340;
  uint local_33c;
  long local_2f8 [8];
  long *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  undefined1 local_264 [28];
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_248;
  MFIter local_240;
  FabArray<amrex::EBCellFlagFab> *local_1e0;
  long local_1d8;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_1d0;
  byte local_1c1;
  int local_1bc;
  undefined8 local_1b0;
  EBSupport local_1a8;
  FabArray<amrex::EBCellFlagFab> *local_1a0;
  int local_194;
  CoordType CStack_190;
  EBSupport local_18c;
  CPC *local_188;
  uint local_180;
  PCData<amrex::FArrayBox> *local_178;
  int local_16c;
  int iStack_168;
  uint local_164;
  undefined8 local_160;
  int local_158;
  FabArray<amrex::EBCellFlagFab> *local_150;
  int local_144;
  CoordType CStack_140;
  int local_13c;
  undefined8 local_138;
  int local_130;
  PCData<amrex::FArrayBox> *local_128;
  int local_11c;
  CpOp CStack_118;
  int local_114;
  int local_110;
  EBSupport local_10c;
  CoordType local_108;
  int local_104;
  long *local_100;
  int local_f8;
  uint local_f4;
  int local_f0;
  int local_ec;
  long *local_e8;
  uint local_dc;
  int local_d8;
  int local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  uint *local_c8;
  undefined4 local_bc;
  undefined1 *local_b8;
  undefined4 local_ac;
  undefined1 *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  BATOp *local_88;
  undefined4 local_7c;
  BATOp *local_78;
  undefined4 local_6c;
  BATOp *local_68;
  undefined4 local_5c;
  PCData<amrex::FArrayBox> *local_58;
  undefined4 local_4c;
  PCData<amrex::FArrayBox> *local_48;
  undefined4 local_3c;
  PCData<amrex::FArrayBox> *local_38;
  undefined4 local_2c;
  FabArray<amrex::EBCellFlagFab> *local_28;
  undefined4 local_1c;
  FabArray<amrex::EBCellFlagFab> *local_18;
  undefined4 local_c;
  FabArray<amrex::EBCellFlagFab> *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffb60 >> 0x38);
  local_1c1 = in_CL & 1;
  local_1bc = in_ESI;
  local_1d0._M_head_impl = (FabArrayBase *)std::numeric_limits<double>::max();
  bVar7 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_fffffffffffffb50);
  if (bVar7) {
    pFVar9 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0xfe7220);
    local_1d8 = __dynamic_cast(pFVar9,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
    if (local_1d8 == 0) {
      __cxa_bad_cast();
    }
    local_1e0 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffffb40);
    MFIter::MFIter(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,(bool)do_tiling_);
    while (bVar7 = MFIter::isValid(&local_240), bVar7) {
      MFIter::growntilebox
                ((MFIter *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffbac);
      local_248._M_head_impl = (PCData<amrex::FArrayBox> *)local_264;
      FabArray<amrex::EBCellFlagFab>::operator[]
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      FVar8 = EBCellFlagFab::getType
                        ((EBCellFlagFab *)in_stack_fffffffffffffc68,(Box *)in_stack_fffffffffffffc60
                        );
      if (FVar8 != covered) {
        pbVar12 = local_2b0;
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (in_stack_fffffffffffffb48,(MFIter *)in_stack_fffffffffffffb40);
        plVar11 = local_2f8;
        local_270 = pbVar12;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffb48,
                   (MFIter *)in_stack_fffffffffffffb40);
        local_178 = local_248._M_head_impl;
        local_38 = local_248._M_head_impl;
        local_3c = 0;
        iVar5 = *(int *)&(local_248._M_head_impl)->cpc;
        local_48 = local_248._M_head_impl;
        local_4c = 1;
        iVar1 = *(int *)((long)&(local_248._M_head_impl)->cpc + 4);
        local_188 = (local_248._M_head_impl)->cpc;
        local_58 = local_248._M_head_impl;
        local_5c = 2;
        local_33c = *(uint *)&(local_248._M_head_impl)->src;
        local_128 = local_248._M_head_impl;
        local_98 = (int *)((long)&(local_248._M_head_impl)->src + 4);
        local_9c = 0;
        iVar2 = *local_98;
        local_a8 = (undefined1 *)((long)&(local_248._M_head_impl)->src + 4);
        local_ac = 1;
        CVar3 = (local_248._M_head_impl)->op;
        local_138 = *(undefined8 *)local_98;
        local_b8 = (undefined1 *)((long)&(local_248._M_head_impl)->src + 4);
        local_bc = 2;
        iVar4 = (local_248._M_head_impl)->tag;
        local_2b8 = plVar11;
        local_180 = local_33c;
        local_16c = iVar5;
        iStack_168 = iVar1;
        local_164 = local_33c;
        local_130 = iVar4;
        local_11c = iVar2;
        CStack_118 = CVar3;
        local_114 = iVar4;
        for (; local_340 = iVar1, (int)local_33c <= iVar4; local_33c = local_33c + 1) {
          for (; local_344 = iVar5, local_340 <= (int)CVar3; local_340 = local_340 + 1) {
            for (; local_344 <= iVar2; local_344 = local_344 + 1) {
              local_d0 = local_270;
              local_d4 = local_344;
              local_d8 = local_340;
              local_dc = local_33c;
              local_c8 = (uint *)(*(long *)local_270 +
                                 ((long)(local_344 - *(int *)(local_270 + 1)) +
                                  (long)(local_340 - *(int *)&local_270[1].field_0x4) *
                                  local_270->_M_string_length +
                                 (long)(int)(local_33c - (int)local_270[1]._M_string_length) *
                                 (local_270->field_2)._M_allocated_capacity) * 4);
              if ((*local_c8 & 3) != 3) {
                local_e8 = local_2b8;
                local_ec = local_344;
                local_f0 = local_340;
                local_f4 = local_33c;
                local_f8 = local_1bc;
                pdVar10 = std::min<double>((double *)&local_1d0,
                                           (double *)
                                           (*local_2b8 +
                                           ((long)(local_344 - (int)local_2b8[4]) +
                                            (long)(local_340 - *(int *)((long)local_2b8 + 0x24)) *
                                            local_2b8[1] +
                                            (long)(int)(local_33c - (int)local_2b8[5]) *
                                            local_2b8[2] + (long)local_1bc * local_2b8[3]) * 8));
                local_1d0._M_head_impl = (FabArrayBase *)*pdVar10;
              }
            }
          }
        }
      }
      MFIter::operator++(&local_240);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffb40);
    comm = (MPI_Comm)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  }
  else {
    MFIter::MFIter(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,(bool)do_tiling_);
    while( true ) {
      bVar7 = MFIter::isValid((MFIter *)&stack0xfffffffffffffc48);
      comm = (MPI_Comm)((ulong)in_stack_fffffffffffffb38 >> 0x20);
      if (!bVar7) break;
      in_stack_fffffffffffffb40 = (FabArray<amrex::EBCellFlagFab> *)&stack0xfffffffffffffc24;
      this_00 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffffc48;
      MFIter::growntilebox
                ((MFIter *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffbac);
      plVar11 = local_428;
      local_3c0 = in_stack_fffffffffffffb40;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_00,(MFIter *)in_stack_fffffffffffffb40);
      local_1a0 = (FabArray<amrex::EBCellFlagFab> *)local_3c0;
      local_8 = (FabArray<amrex::EBCellFlagFab> *)local_3c0;
      local_c = 0;
      iVar5 = *(int *)local_3c0;
      local_18 = (FabArray<amrex::EBCellFlagFab> *)local_3c0;
      local_1c = 1;
      CVar6 = *(CoordType *)(local_3c0 + 4);
      local_1b0 = *(undefined8 *)local_3c0;
      local_28 = (FabArray<amrex::EBCellFlagFab> *)local_3c0;
      local_2c = 2;
      local_46c = (((BoxArray *)(local_3c0 + 8))->m_bat).m_bat_type;
      local_150 = (FabArray<amrex::EBCellFlagFab> *)local_3c0;
      local_68 = (BATOp *)(local_3c0 + 0xc);
      local_6c = 0;
      in_stack_fffffffffffffbac = *(int *)local_68;
      local_78 = (BATOp *)(local_3c0 + 0xc);
      local_7c = 1;
      in_stack_fffffffffffffbb0 = (((Geometry *)(local_3c0 + 0x10))->super_CoordSys).c_sys;
      local_160 = *(undefined8 *)local_68;
      local_88 = (BATOp *)(local_3c0 + 0xc);
      local_8c = 2;
      in_stack_fffffffffffffbb4 = *(int *)(local_3c0 + 0x14);
      local_3e8 = plVar11;
      local_1a8 = local_46c;
      local_194 = iVar5;
      CStack_190 = CVar6;
      local_18c = local_46c;
      local_158 = in_stack_fffffffffffffbb4;
      local_144 = in_stack_fffffffffffffbac;
      CStack_140 = in_stack_fffffffffffffbb0;
      local_13c = in_stack_fffffffffffffbb4;
      for (; local_470 = CVar6, (int)local_46c <= in_stack_fffffffffffffbb4;
          local_46c = local_46c + basic) {
        for (; local_474 = iVar5, local_470 <= in_stack_fffffffffffffbb0; local_470 = local_470 + RZ
            ) {
          for (; local_474 <= in_stack_fffffffffffffbac; local_474 = local_474 + 1) {
            local_100 = local_3e8;
            local_104 = local_474;
            local_108 = local_470;
            local_10c = local_46c;
            local_110 = local_1bc;
            in_stack_fffffffffffffb38 =
                 (MFIter *)
                 std::min<double>((double *)&local_1d0,
                                  (double *)
                                  (*local_3e8 +
                                  ((long)(local_474 - (int)local_3e8[4]) +
                                   (long)(local_470 - *(int *)((long)local_3e8 + 0x24)) *
                                   local_3e8[1] +
                                   (long)(int)(local_46c - (int)local_3e8[5]) * local_3e8[2] +
                                  (long)local_1bc * local_3e8[3]) * 8));
            local_1d0._M_head_impl =
                 (in_stack_fffffffffffffb38->m_fa)._M_t.
                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          }
        }
      }
      MFIter::operator++((MFIter *)&stack0xfffffffffffffc48);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffffb40);
  }
  if ((local_1c1 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Min<double>((double *)in_stack_fffffffffffffb40,comm);
  }
  return (Real)local_1d0._M_head_impl;
}

Assistant:

Real
MultiFab::min (int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::min()");

    BL_ASSERT(nghost >= 0 && nghost <= n_grow.min());

    Real mn = std::numeric_limits<Real>::max();

#ifdef AMREX_USE_EB
    if ( this->hasEBFabFactory() )
    {
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(this->Factory());
        auto const& flags = ebfactory.getMultiEBCellFlagFab();
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            auto const& flagsma = flags.const_arrays();
            auto const& ma = this->const_arrays();
            mn = ParReduce(TypeList<ReduceOpMin>{}, TypeList<Real>{}, *this, IntVect(nghost),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
            {
                if (flagsma[box_no](i,j,k).isCovered()) {
                    return AMREX_REAL_MAX;
                } else {
                    return ma[box_no](i,j,k,comp);
                }
            });
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(min:mn)
#endif
            for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
                Box const& bx = mfi.growntilebox(nghost);
                if (flags[mfi].getType(bx) != FabType::covered) {
                    auto const& flag = flags.const_array(mfi);
                    auto const& a = this->const_array(mfi);
                    AMREX_LOOP_3D(bx, i, j, k,
                    {
                        if (!flag(i,j,k).isCovered()) {
                            mn = std::min(mn, a(i,j,k,comp));
                        }
                    });
                }
            }
        }
    }
    else
#endif
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            auto const& ma = this->const_arrays();
            mn = ParReduce(TypeList<ReduceOpMin>{}, TypeList<Real>{}, *this, IntVect(nghost),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
            {
                return ma[box_no](i,j,k,comp);
            });
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(min:mn)
#endif
            for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
                Box const& bx = mfi.growntilebox(nghost);
                auto const& a = this->const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    mn = std::min(mn, a(i,j,k,comp));
                });
            }
        }
    }

    if (!local) {
        ParallelAllReduce::Min(mn, ParallelContext::CommunicatorSub());
    }

    return mn;
}